

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void __thiscall
ExpressionContext::ExpressionContext
          (ExpressionContext *this,Allocator *allocator,int optimizationLevel)

{
  ModuleData **ppMVar1;
  ModuleData **ppMVar2;
  ModuleData **ppMVar3;
  NamespaceData **ppNVar4;
  TypeBase **ppTVar5;
  FunctionData **ppFVar6;
  VariableData **ppVVar7;
  ExprBase **ppEVar8;
  ExprBase **ppEVar9;
  VariableData **ppVVar10;
  Node *pNVar11;
  VariableData **ppVVar12;
  TypeFunction **ppTVar13;
  TypeFunctionSet **ppTVar14;
  TypeGenericAlias **ppTVar15;
  TypeGenericClass **ppTVar16;
  TypePair *pTVar17;
  NamespaceData **ppNVar18;
  Node *dst;
  ErrorInfo **ppEVar19;
  void *pvVar20;
  undefined8 *puVar21;
  Allocator *pAVar22;
  int iVar23;
  long lVar24;
  undefined4 extraout_var;
  Node **__s;
  char *__function;
  Node *dst_00;
  
  this->optimizationLevel = optimizationLevel;
  (this->uniqueDependencies).allocator = (Allocator *)0x0;
  ppMVar1 = (this->uniqueDependencies).little;
  (this->uniqueDependencies).data = ppMVar1;
  (this->uniqueDependencies).count = 0;
  (this->uniqueDependencies).max = 0x80;
  dst_00 = (this->uniqueDependencyMap).storage;
  lVar24 = -0xc00;
  do {
    puVar21 = (undefined8 *)((long)(this->imports).little + lVar24 + -0x18);
    *puVar21 = 0;
    puVar21[1] = 0;
    lVar24 = lVar24 + 0x18;
  } while (lVar24 != 0);
  (this->uniqueDependencyMap).allocator = (Allocator *)0x0;
  (this->uniqueDependencyMap).bucketCount = 0x80;
  (this->uniqueDependencyMap).count = 0;
  (this->uniqueDependencyMap).data = dst_00;
  NULLC::fillMemory(dst_00,0,0xc00);
  (this->imports).allocator = (Allocator *)0x0;
  ppMVar2 = (this->imports).little;
  (this->imports).data = ppMVar2;
  (this->imports).count = 0;
  (this->imports).max = 0x80;
  (this->implicitImports).allocator = (Allocator *)0x0;
  ppMVar3 = (this->implicitImports).little;
  (this->implicitImports).data = ppMVar3;
  (this->implicitImports).count = 0;
  (this->implicitImports).max = 0x80;
  (this->namespaces).allocator = (Allocator *)0x0;
  ppNVar4 = (this->namespaces).little;
  (this->namespaces).data = ppNVar4;
  (this->namespaces).count = 0;
  (this->namespaces).max = 0x80;
  (this->types).allocator = (Allocator *)0x0;
  ppTVar5 = (this->types).little;
  (this->types).data = ppTVar5;
  (this->types).count = 0;
  (this->types).max = 0x80;
  (this->functions).allocator = (Allocator *)0x0;
  ppFVar6 = (this->functions).little;
  (this->functions).data = ppFVar6;
  (this->functions).count = 0;
  (this->functions).max = 0x80;
  (this->variables).allocator = (Allocator *)0x0;
  ppVVar7 = (this->variables).little;
  (this->variables).data = ppVVar7;
  (this->variables).max = 0x80;
  (this->variables).count = 0;
  (this->definitions).allocator = (Allocator *)0x0;
  ppEVar8 = (this->definitions).little;
  (this->definitions).data = ppEVar8;
  (this->definitions).count = 0;
  (this->definitions).max = 0x80;
  (this->setup).allocator = (Allocator *)0x0;
  ppEVar9 = (this->setup).little;
  (this->setup).data = ppEVar9;
  (this->setup).count = 0;
  (this->setup).max = 0x80;
  (this->vtables).allocator = (Allocator *)0x0;
  ppVVar10 = (this->vtables).little;
  (this->vtables).data = ppVVar10;
  (this->vtables).count = 0;
  (this->vtables).max = 0x80;
  pNVar11 = (this->vtableMap).storage;
  lVar24 = -0xc00;
  do {
    puVar21 = (undefined8 *)((long)(this->upvalues).little + lVar24 + -0x18);
    *puVar21 = 0;
    puVar21[1] = 0;
    lVar24 = lVar24 + 0x18;
  } while (lVar24 != 0);
  (this->vtableMap).allocator = (Allocator *)0x0;
  (this->vtableMap).bucketCount = 0x80;
  (this->vtableMap).count = 0;
  (this->vtableMap).data = pNVar11;
  NULLC::fillMemory(pNVar11,0,0xc00);
  (this->upvalues).allocator = (Allocator *)0x0;
  ppVVar12 = (this->upvalues).little;
  (this->upvalues).data = ppVVar12;
  (this->upvalues).count = 0;
  (this->upvalues).max = 0x80;
  pNVar11 = (this->upvalueMap).storage;
  lVar24 = -0xc00;
  do {
    puVar21 = (undefined8 *)((long)(this->functionTypes).little + lVar24 + -0x18);
    *puVar21 = 0;
    puVar21[1] = 0;
    lVar24 = lVar24 + 0x18;
  } while (lVar24 != 0);
  (this->upvalueMap).allocator = (Allocator *)0x0;
  (this->upvalueMap).bucketCount = 0x80;
  (this->upvalueMap).count = 0;
  (this->upvalueMap).data = pNVar11;
  NULLC::fillMemory(pNVar11,0,0xc00);
  (this->functionTypes).allocator = (Allocator *)0x0;
  ppTVar13 = (this->functionTypes).little;
  (this->functionTypes).data = ppTVar13;
  (this->functionTypes).count = 0;
  (this->functionTypes).max = 0x80;
  (this->functionSetTypes).allocator = (Allocator *)0x0;
  ppTVar14 = (this->functionSetTypes).little;
  (this->functionSetTypes).data = ppTVar14;
  (this->functionSetTypes).count = 0;
  (this->functionSetTypes).max = 0x80;
  (this->genericAliasTypes).allocator = (Allocator *)0x0;
  ppTVar15 = (this->genericAliasTypes).little;
  (this->genericAliasTypes).data = ppTVar15;
  (this->genericAliasTypes).count = 0;
  (this->genericAliasTypes).max = 0x80;
  (this->genericClassTypes).allocator = (Allocator *)0x0;
  ppTVar16 = (this->genericClassTypes).little;
  (this->genericClassTypes).data = ppTVar16;
  (this->genericClassTypes).count = 0;
  (this->genericClassTypes).max = 0x80;
  (this->genericTypeMap).nodePool.first = (StackChunk *)0x0;
  (this->genericTypeMap).nodePool.curr = (StackChunk *)0x0;
  (this->genericTypeMap).nodePool.size = 0xffc;
  (this->genericTypeMap).allocator = (Allocator *)0x0;
  (this->genericTypeMap).freeList.allocator = (Allocator *)0x0;
  (this->genericTypeMap).freeList.data = (this->genericTypeMap).freeList.little;
  (this->genericTypeMap).freeList.max = 0x20;
  (this->genericTypeMap).freeList.count = 0;
  (this->genericTypeMap).entries = (Node **)0x0;
  SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
  ::SmallDenseMap(&this->genericFunctionInstanceTypeMap,(Allocator *)0x0);
  pTVar17 = (this->noAssignmentOperatorForTypePair).storage;
  memset(pTVar17,0,0x208);
  (this->noAssignmentOperatorForTypePair).bucketCount = 0x20;
  (this->noAssignmentOperatorForTypePair).count = 0;
  (this->noAssignmentOperatorForTypePair).data = pTVar17;
  NULLC::fillMemory(pTVar17,0,0x200);
  pTVar17 = (this->noIndexOperatorForTypePair).storage;
  memset(pTVar17,0,0x208);
  (this->noIndexOperatorForTypePair).bucketCount = 0x20;
  (this->noIndexOperatorForTypePair).count = 0;
  (this->noIndexOperatorForTypePair).data = pTVar17;
  NULLC::fillMemory(pTVar17,0,0x200);
  lVar24 = 0;
  do {
    *(undefined8 *)((long)(this->noUnaryOperatorForTypePair).data[0].storage + lVar24 + 0x20) = 0;
    *(undefined8 *)((long)(this->noUnaryOperatorForTypePair).data[0].storage + lVar24 + -0x10) = 4;
    pvVar20 = (void *)((long)(this->noUnaryOperatorForTypePair).data[0].storage + lVar24);
    *(void **)((long)(this->noUnaryOperatorForTypePair).data[0].storage + lVar24 + -8) = pvVar20;
    NULLC::fillMemory(pvVar20,0,0x20);
    lVar24 = lVar24 + 0x38;
  } while (lVar24 != 0xe0);
  lVar24 = 0;
  do {
    pvVar20 = (void *)((long)&(this->noBinaryOperatorForTypePair).data[0].storage[0].a + lVar24);
    puVar21 = (undefined8 *)
              ((long)&(this->noBinaryOperatorForTypePair).data[0].storage[3].a + lVar24);
    *puVar21 = 0;
    puVar21[1] = 0;
    puVar21 = (undefined8 *)
              ((long)&(this->noBinaryOperatorForTypePair).data[0].storage[2].a + lVar24);
    *puVar21 = 0;
    puVar21[1] = 0;
    puVar21 = (undefined8 *)
              ((long)&(this->noBinaryOperatorForTypePair).data[0].storage[1].a + lVar24);
    *puVar21 = 0;
    puVar21[1] = 0;
    puVar21 = (undefined8 *)
              ((long)&(this->noBinaryOperatorForTypePair).data[0].storage[0].a + lVar24);
    *puVar21 = 0;
    puVar21[1] = 0;
    *(undefined8 *)((long)((this->noBinaryOperatorForTypePair).data[0].storage + 4) + lVar24) = 0;
    *(undefined8 *)
     ((long)&((SmallDenseSet<TypePair,_TypePairHasher,_4U> *)
             ((this->noBinaryOperatorForTypePair).data[0].storage + -1))->bucketCount + lVar24) = 4;
    *(void **)((long)(this->noBinaryOperatorForTypePair).data[0].storage + lVar24 + -8) = pvVar20;
    NULLC::fillMemory(pvVar20,0,0x40);
    lVar24 = lVar24 + 0x58;
  } while (lVar24 != 0x738);
  lVar24 = 0;
  do {
    pvVar20 = (void *)((long)&(this->noModifyOperatorForTypePair).data[0].storage[0].a + lVar24);
    puVar21 = (undefined8 *)
              ((long)&(this->noModifyOperatorForTypePair).data[0].storage[3].a + lVar24);
    *puVar21 = 0;
    puVar21[1] = 0;
    puVar21 = (undefined8 *)
              ((long)&(this->noModifyOperatorForTypePair).data[0].storage[2].a + lVar24);
    *puVar21 = 0;
    puVar21[1] = 0;
    puVar21 = (undefined8 *)
              ((long)&(this->noModifyOperatorForTypePair).data[0].storage[1].a + lVar24);
    *puVar21 = 0;
    puVar21[1] = 0;
    puVar21 = (undefined8 *)
              ((long)&(this->noModifyOperatorForTypePair).data[0].storage[0].a + lVar24);
    *puVar21 = 0;
    puVar21[1] = 0;
    *(undefined8 *)((long)((this->noModifyOperatorForTypePair).data[0].storage + 4) + lVar24) = 0;
    *(undefined8 *)
     ((long)&((SmallDenseSet<TypePair,_TypePairHasher,_4U> *)
             ((this->noModifyOperatorForTypePair).data[0].storage + -1))->bucketCount + lVar24) = 4;
    *(void **)((long)(this->noModifyOperatorForTypePair).data[0].storage + lVar24 + -8) = pvVar20;
    NULLC::fillMemory(pvVar20,0,0x40);
    lVar24 = lVar24 + 0x58;
  } while (lVar24 != 0x3c8);
  SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>::
  SmallDenseMap(&this->newConstructorFunctions,(Allocator *)0x0);
  (this->globalNamespaces).allocator = (Allocator *)0x0;
  ppNVar18 = (this->globalNamespaces).little;
  (this->globalNamespaces).data = ppNVar18;
  (this->globalNamespaces).count = 0;
  (this->globalNamespaces).max = 2;
  (this->globalCloseUpvalues).head = (CloseUpvaluesData *)0x0;
  (this->globalCloseUpvalues).tail = (CloseUpvaluesData *)0x0;
  dst = (this->internalTypeMap).storage;
  lVar24 = 0;
  do {
    puVar21 = (undefined8 *)((long)&(dst->key).typeName.begin + lVar24);
    *puVar21 = 0;
    puVar21[1] = 0;
    *(undefined8 *)((long)&(this->internalTypeMap).storage[0].key.importModule + lVar24) = 0;
    lVar24 = lVar24 + 0x20;
  } while (lVar24 != 0x400);
  (this->internalTypeMap).allocator = (Allocator *)0x0;
  (this->internalTypeMap).bucketCount = 0x20;
  (this->internalTypeMap).count = 0;
  (this->internalTypeMap).data = dst;
  NULLC::fillMemory(dst,0,0x400);
  DirectChainedMap<TypeFunction_*>::DirectChainedMap(&this->functionTypeMap,allocator);
  (this->errorInfo).allocator = (Allocator *)0x0;
  ppEVar19 = (this->errorInfo).little;
  (this->errorInfo).data = ppEVar19;
  (this->errorInfo).count = 0;
  (this->errorInfo).max = 4;
  CompilerStatistics::CompilerStatistics(&this->statistics);
  this->allocator = allocator;
  this->baseModuleFunctionCount = 0;
  this->code = (char *)0x0;
  this->codeEnd = (char *)0x0;
  this->moduleRoot = (char *)0x0;
  if ((this->uniqueDependencies).data == ppMVar1) {
    (this->uniqueDependencies).allocator = allocator;
    SmallDenseMap<InplaceStr,_ModuleData_*,_InplaceStrHasher,_128U>::set_allocator
              (&this->uniqueDependencyMap,allocator);
    if (((this->imports).data == ppMVar2) &&
       ((this->imports).allocator = allocator, (this->implicitImports).data == ppMVar3)) {
      (this->implicitImports).allocator = allocator;
      if ((this->namespaces).data == ppNVar4) {
        (this->namespaces).allocator = allocator;
        if ((this->types).data == ppTVar5) {
          (this->types).allocator = allocator;
          if ((this->functions).data == ppFVar6) {
            (this->functions).allocator = allocator;
            if ((this->variables).data == ppVVar7) {
              (this->variables).allocator = allocator;
              if (((this->definitions).data != ppEVar8) ||
                 ((this->definitions).allocator = allocator, (this->setup).data != ppEVar9)) {
                __function = 
                "void SmallArray<ExprBase *, 128>::set_allocator(Allocator *) [T = ExprBase *, N = 128]"
                ;
                goto LAB_001d7245;
              }
              (this->setup).allocator = allocator;
              if ((this->vtables).data == ppVVar10) {
                (this->vtables).allocator = allocator;
                SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::set_allocator
                          (&this->vtableMap,allocator);
                if ((this->upvalues).data == ppVVar12) {
                  (this->upvalues).allocator = allocator;
                  SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::set_allocator
                            (&this->upvalueMap,allocator);
                  if ((this->functionTypes).data == ppTVar13) {
                    (this->functionTypes).allocator = allocator;
                    if ((this->functionSetTypes).data == ppTVar14) {
                      (this->functionSetTypes).allocator = allocator;
                      if ((this->genericAliasTypes).data == ppTVar15) {
                        (this->genericAliasTypes).allocator = allocator;
                        if ((this->genericClassTypes).data == ppTVar16) {
                          (this->genericClassTypes).allocator = allocator;
                          HashMap<TypeClass_*>::set_allocator(&this->genericTypeMap,allocator);
                          SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
                          ::set_allocator(&this->genericFunctionInstanceTypeMap,allocator);
                          SmallDenseSet<TypePair,_TypePairHasher,_32U>::set_allocator
                                    (&this->noAssignmentOperatorForTypePair,allocator);
                          SmallDenseSet<TypePair,_TypePairHasher,_32U>::set_allocator
                                    (&this->noIndexOperatorForTypePair,allocator);
                          lVar24 = 0;
                          do {
                            SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>::set_allocator
                                      ((SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U> *)
                                       ((long)(this->noUnaryOperatorForTypePair).data[0].storage +
                                       lVar24 + -0x10),allocator);
                            lVar24 = lVar24 + 0x38;
                          } while (lVar24 != 0xe0);
                          lVar24 = 0;
                          do {
                            SmallDenseSet<TypePair,_TypePairHasher,_4U>::set_allocator
                                      ((SmallDenseSet<TypePair,_TypePairHasher,_4U> *)
                                       ((long)&((SmallDenseSet<TypePair,_TypePairHasher,_4U> *)
                                               ((this->noBinaryOperatorForTypePair).data[0].storage
                                               + -1))->bucketCount + lVar24),allocator);
                            lVar24 = lVar24 + 0x58;
                          } while (lVar24 != 0x738);
                          lVar24 = 0;
                          do {
                            SmallDenseSet<TypePair,_TypePairHasher,_4U>::set_allocator
                                      ((SmallDenseSet<TypePair,_TypePairHasher,_4U> *)
                                       ((long)&((SmallDenseSet<TypePair,_TypePairHasher,_4U> *)
                                               ((this->noModifyOperatorForTypePair).data[0].storage
                                               + -1))->bucketCount + lVar24),allocator);
                            lVar24 = lVar24 + 0x58;
                          } while (lVar24 != 0x3c8);
                          SmallDenseMap<TypedFunctionInstanceRequest,_ExprBase_*,_TypedFunctionInstanceRequestHasher,_32U>
                          ::set_allocator(&this->newConstructorFunctions,allocator);
                          SmallDenseMap<TypeModulePair,_TypeBase_*,_TypeModulePairHasher,_32U>::
                          set_allocator(&this->internalTypeMap,allocator);
                          this->errorHandlerActive = false;
                          this->errorHandlerNested = false;
                          this->errorPos = (char *)0x0;
                          this->errorCount = 0;
                          this->errorBuf = (char *)0x0;
                          this->errorBufSize = 0;
                          this->errorBufLocation = (char *)0x0;
                          if ((this->errorInfo).data == ppEVar19) {
                            (this->errorInfo).allocator = allocator;
                            this->scope = (ScopeData *)0x0;
                            this->lookupLocation = (SynBase *)0x0;
                            this->globalScope = (ScopeData *)0x0;
                            this->typeVoid = (TypeBase *)0x0;
                            this->typeBool = (TypeBase *)0x0;
                            this->typeChar = (TypeBase *)0x0;
                            this->typeShort = (TypeBase *)0x0;
                            this->typeInt = (TypeBase *)0x0;
                            this->typeLong = (TypeBase *)0x0;
                            this->typeFloat = (TypeBase *)0x0;
                            this->typeDouble = (TypeBase *)0x0;
                            this->typeTypeID = (TypeBase *)0x0;
                            this->typeFunctionID = (TypeBase *)0x0;
                            this->typeNullPtr = (TypeBase *)0x0;
                            this->typeGeneric = (TypeBase *)0x0;
                            this->typeAuto = (TypeBase *)0x0;
                            this->typeAutoRef = (TypeStruct *)0x0;
                            this->typeAutoArray = (TypeStruct *)0x0;
                            if ((this->globalNamespaces).data == ppNVar18) {
                              (this->globalNamespaces).allocator = allocator;
                              this->functionInstanceDepth = 0;
                              this->classInstanceDepth = 0;
                              this->expressionDepth = 0;
                              this->memoryLimit = 0;
                              if ((this->genericTypeMap).entries == (Node **)0x0) {
                                pAVar22 = (this->genericTypeMap).allocator;
                                if (pAVar22 == (Allocator *)0x0) {
                                  __s = (Node **)(*(code *)NULLC::alloc)(0x2004);
                                }
                                else {
                                  iVar23 = (*pAVar22->_vptr_Allocator[2])();
                                  __s = (Node **)CONCAT44(extraout_var,iVar23);
                                }
                                (this->genericTypeMap).entries = __s;
                                memset(__s,0,0x2000);
                              }
                              this->uniqueAliasId = 0;
                              this->uniqueScopeId = 0;
                              this->unnamedFuncCount = 0;
                              this->unnamedVariableCount = 0;
                              this->uniqueNamespaceId = 0;
                              this->uniqueVariableId = 0;
                              this->uniqueFunctionId = 0;
                              this->uniqueAliasId = 0;
                              return;
                            }
                            __function = 
                            "void SmallArray<NamespaceData *, 2>::set_allocator(Allocator *) [T = NamespaceData *, N = 2]"
                            ;
                          }
                          else {
                            __function = 
                            "void SmallArray<ErrorInfo *, 4>::set_allocator(Allocator *) [T = ErrorInfo *, N = 4]"
                            ;
                          }
                        }
                        else {
                          __function = 
                          "void SmallArray<TypeGenericClass *, 128>::set_allocator(Allocator *) [T = TypeGenericClass *, N = 128]"
                          ;
                        }
                      }
                      else {
                        __function = 
                        "void SmallArray<TypeGenericAlias *, 128>::set_allocator(Allocator *) [T = TypeGenericAlias *, N = 128]"
                        ;
                      }
                    }
                    else {
                      __function = 
                      "void SmallArray<TypeFunctionSet *, 128>::set_allocator(Allocator *) [T = TypeFunctionSet *, N = 128]"
                      ;
                    }
                  }
                  else {
                    __function = 
                    "void SmallArray<TypeFunction *, 128>::set_allocator(Allocator *) [T = TypeFunction *, N = 128]"
                    ;
                  }
                  goto LAB_001d7245;
                }
              }
            }
            __function = 
            "void SmallArray<VariableData *, 128>::set_allocator(Allocator *) [T = VariableData *, N = 128]"
            ;
          }
          else {
            __function = 
            "void SmallArray<FunctionData *, 128>::set_allocator(Allocator *) [T = FunctionData *, N = 128]"
            ;
          }
        }
        else {
          __function = 
          "void SmallArray<TypeBase *, 128>::set_allocator(Allocator *) [T = TypeBase *, N = 128]";
        }
      }
      else {
        __function = 
        "void SmallArray<NamespaceData *, 128>::set_allocator(Allocator *) [T = NamespaceData *, N = 128]"
        ;
      }
      goto LAB_001d7245;
    }
  }
  __function = 
  "void SmallArray<ModuleData *, 128>::set_allocator(Allocator *) [T = ModuleData *, N = 128]";
LAB_001d7245:
  __assert_fail("data == little",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x13c,__function);
}

Assistant:

ExpressionContext::ExpressionContext(Allocator *allocator, int optimizationLevel): optimizationLevel(optimizationLevel), functionTypeMap(allocator), allocator(allocator)
{
	code = NULL;
	codeEnd = NULL;

	moduleRoot = NULL;

	baseModuleFunctionCount = 0;

	uniqueDependencies.set_allocator(allocator);
	uniqueDependencyMap.set_allocator(allocator);

	imports.set_allocator(allocator);
	implicitImports.set_allocator(allocator);
	namespaces.set_allocator(allocator);
	types.set_allocator(allocator);
	functions.set_allocator(allocator);
	variables.set_allocator(allocator);

	definitions.set_allocator(allocator);
	setup.set_allocator(allocator);

	vtables.set_allocator(allocator);
	vtableMap.set_allocator(allocator);

	upvalues.set_allocator(allocator);
	upvalueMap.set_allocator(allocator);

	functionTypes.set_allocator(allocator);
	functionSetTypes.set_allocator(allocator);
	genericAliasTypes.set_allocator(allocator);
	genericClassTypes.set_allocator(allocator);

	genericTypeMap.set_allocator(allocator);

	genericFunctionInstanceTypeMap.set_allocator(allocator);

	noAssignmentOperatorForTypePair.set_allocator(allocator);

	noIndexOperatorForTypePair.set_allocator(allocator);

	for(unsigned i = 0; i < noUnaryOperatorForTypePair.size(); i++)
		noUnaryOperatorForTypePair[i].set_allocator(allocator);

	for(unsigned i = 0; i < noBinaryOperatorForTypePair.size(); i++)
		noBinaryOperatorForTypePair[i].set_allocator(allocator);

	for(unsigned i = 0; i < noModifyOperatorForTypePair.size(); i++)
		noModifyOperatorForTypePair[i].set_allocator(allocator);

	newConstructorFunctions.set_allocator(allocator);

	internalTypeMap.set_allocator(allocator);

	errorHandlerActive = false;
	errorHandlerNested = false;
	errorPos = NULL;
	errorCount = 0;
	errorBuf = NULL;
	errorBufSize = 0;
	errorBufLocation = NULL;

	errorInfo.set_allocator(allocator);

	typeVoid = NULL;

	typeBool = NULL;

	typeChar = NULL;
	typeShort = NULL;
	typeInt = NULL;
	typeLong = NULL;

	typeFloat = NULL;
	typeDouble = NULL;

	typeTypeID = NULL;
	typeFunctionID = NULL;
	typeNullPtr = NULL;

	typeGeneric = NULL;

	typeAuto = NULL;
	typeAutoRef = NULL;
	typeAutoArray = NULL;

	scope = NULL;
	lookupLocation = NULL;

	globalScope = NULL;
	globalNamespaces.set_allocator(allocator);

	functionInstanceDepth = 0;
	classInstanceDepth = 0;
	expressionDepth = 0;

	memoryLimit = 0;

	genericTypeMap.init();

	uniqueNamespaceId = 0;
	uniqueVariableId = 0;
	uniqueFunctionId = 0;
	uniqueAliasId = 0;
	uniqueScopeId = 0;

	unnamedFuncCount = 0;
	unnamedVariableCount = 0;
}